

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O1

int beast::lexicalCastThrow<int,char*>(char *in)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 *puVar2;
  int out;
  LexicalCast<int,_char_*> local_5;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  bVar1 = detail::LexicalCast<int,_char_*>::operator()(&local_5,&local_4,in);
  if (bVar1) {
    return local_4;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_002d84a8;
  __cxa_throw(puVar2,&BadLexicalCast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

Out lexicalCastThrow (In in)
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    throw BadLexicalCast ();
}